

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

natwm_error string_append(char **destination,char *append)

{
  natwm_error nVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  
  pcVar4 = *destination;
  sVar2 = strlen(pcVar4);
  sVar3 = strlen(append);
  pcVar4 = (char *)realloc(pcVar4,sVar3 + sVar2 + 1);
  if (pcVar4 == (char *)0x0) {
    free(*destination);
    nVar1 = MEMORY_ALLOCATION_ERROR;
  }
  else {
    *destination = pcVar4;
    strncpy(pcVar4 + sVar2,append,sVar3 + 1);
    nVar1 = NO_ERROR;
  }
  return nVar1;
}

Assistant:

natwm_error string_append(char **destination, const char *append)
{
        size_t destination_size = strlen(*destination);
        size_t append_size = strlen(append) + 1;
        size_t result_size = destination_size + append_size;
        char *tmp = realloc(*destination, result_size);

        if (tmp == NULL) {
                free(*destination);

                return MEMORY_ALLOCATION_ERROR;
        }

        *destination = tmp;

        strncpy(*destination + destination_size, append, append_size);

        return NO_ERROR;
}